

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O3

FT_Error af_latin_metrics_init(AF_LatinMetrics metrics,FT_Face face)

{
  char cVar1;
  ushort uVar2;
  AF_Blue_Stringset AVar3;
  uint uVar4;
  FT_Memory memory_00;
  FT_GlyphSlot_conflict pFVar5;
  undefined1 *puVar6;
  FT_Pos FVar7;
  uint uVar8;
  FT_Error FVar9;
  AF_Blue_String AVar10;
  uint uVar11;
  FT_UInt FVar12;
  long *plVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  AF_LatinBlueRec *pAVar18;
  AF_Blue_StringRec *pAVar19;
  uint *p;
  FT_Bool FVar20;
  uint uVar21;
  FT_Pos *pFVar22;
  AF_Blue_StringRec *pAVar23;
  long lVar24;
  ulong uVar25;
  AF_Blue_StringRec *pAVar26;
  long lVar27;
  FT_CharMap charmap;
  bool bVar28;
  ushort uVar29;
  int iVar30;
  uint uVar31;
  ulong uVar32;
  long lVar33;
  long *plVar34;
  uint uVar35;
  uint uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  uint uVar40;
  long lVar41;
  ulong uVar42;
  long *plVar43;
  uint uVar44;
  long lVar45;
  int iVar46;
  FT_Face pFVar47;
  AF_LatinMetrics pAVar48;
  FT_Memory memory;
  long lVar49;
  undefined8 uVar50;
  bool bVar51;
  uint auStack_c3d8 [2];
  AF_LatinMetricsRec dummy [1];
  AF_GlyphHintsRec hints [1];
  FT_UInt local_178 [2];
  uint num_idx_1;
  long local_120;
  long local_118;
  ulong local_110;
  ulong local_108;
  undefined1 *local_100;
  ulong local_f8;
  FT_CharMap local_f0;
  ulong local_e8;
  long local_e0;
  char *local_d8;
  AF_LatinBlueRec *local_d0;
  FT_UInt local_c8;
  uint local_c4;
  long local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  long *local_a0;
  AF_Blue_StringRec *local_98;
  char *local_90;
  uint local_84;
  FT_Vector *local_80;
  FT_Pos *local_78;
  uint local_6c;
  uint local_68;
  uint local_64;
  FT_Face local_60;
  uint local_54;
  AF_LatinMetrics local_50;
  ulong local_48;
  FT_UInt local_3c;
  ulong local_38;
  
  charmap = face->charmap;
  metrics->units_per_em = (uint)face->units_per_EM;
  FVar9 = FT_Select_Charmap(face,FT_ENCODING_UNICODE);
  if (FVar9 != 0) goto LAB_0023960b;
  memory_00 = face->memory;
  local_f0 = charmap;
  local_60 = face;
  memset(hints,0,0x1430);
  metrics->axis[0].width_count = 0;
  metrics->axis[1].width_count = 0;
  pcVar14 = af_script_classes[((metrics->root).style_class)->script]->standard_charstring;
  dummy[0].axis[1].org_delta = (FT_Pos)memory_00;
  local_50 = metrics;
  plVar13 = (long *)ft_mem_alloc(memory_00,8,(FT_Error *)auStack_c3d8);
  cVar1 = *pcVar14;
  if (cVar1 != '\0') {
    do {
      while (cVar1 == ' ') {
        cVar1 = pcVar14[1];
        pcVar14 = pcVar14 + 1;
      }
      pcVar14 = af_shaper_get_cluster(pcVar14,&local_50->root,plVar13,auStack_c3d8);
      pFVar47 = local_60;
      if ((auStack_c3d8[0] < 2) && (lVar15 = *plVar13, lVar15 != 0)) {
        ft_mem_free(local_60->memory,plVar13);
        FVar9 = FT_Load_Glyph(pFVar47,(FT_UInt)lVar15,1);
        if ((FVar9 != 0) || (pFVar5 = local_60->glyph, (pFVar5->outline).n_points < 1))
        goto LAB_002389a7;
        memset(auStack_c3d8,0,0x8fe0);
        dummy[0].root.globals._0_4_ = local_50->units_per_em;
        dummy[0].root.scaler.face = (FT_Face)0x10000;
        dummy[0].root.scaler.x_scale = 0x10000;
        dummy[0].root.scaler.y_scale = 0;
        dummy[0].root.scaler.x_delta = 0;
        dummy[0].root.style_class = (AF_StyleClass)local_60;
        hints[0].axis[1].embedded.edges[0xb].last._0_4_ = 0;
        hints[0]._5144_8_ = auStack_c3d8;
        FVar9 = af_glyph_hints_reload((AF_GlyphHints)&dummy[0].axis[1].org_delta,&pFVar5->outline);
        if (FVar9 != 0) goto LAB_002389a7;
        uVar50 = CONCAT71((int7)((ulong)lVar15 >> 8),1);
        lVar15 = 0;
        goto LAB_002396f3;
      }
      cVar1 = *pcVar14;
    } while (cVar1 != '\0');
  }
  ft_mem_free(local_60->memory,plVar13);
  goto LAB_002389a7;
LAB_00239147:
  do {
    uVar21 = (int)uVar37 + 1;
    if ((int)(uint)local_48 <= (int)uVar37) {
      uVar21 = (uint)local_38;
    }
    uVar37 = (ulong)uVar21;
    uVar39 = local_80[(int)uVar21].y - lVar27;
    uVar25 = -uVar39;
    if (0 < (long)uVar39) {
      uVar25 = uVar39;
    }
    uVar31 = local_84;
    if (5 < uVar25) {
      uVar39 = local_80[(int)uVar11].x - lVar41;
      uVar25 = -uVar39;
      if (0 < (long)uVar39) {
        uVar25 = uVar39;
      }
      if (uVar25 <= uVar17) {
        lVar33 = lVar27;
        uVar44 = (uint)uVar32;
        uVar40 = (uint)local_48;
        if ((int)(uint)local_38 < (int)uVar21) {
          uVar40 = uVar21 - 1;
        }
        break;
      }
    }
    uVar44 = uVar36;
    if ((int)uVar36 < 0) {
      uVar44 = uVar21;
    }
    if ((local_90[(int)uVar21] & 3U) == 1) {
      uVar36 = uVar44;
    }
    lVar33 = local_118;
    uVar32 = uVar37;
    uVar44 = uVar35;
    uVar40 = uVar35;
  } while (uVar21 != uVar35);
LAB_00239054:
  if (((int)uVar36 < 0) || ((int)uVar44 < 0)) {
LAB_002390a7:
    uVar32 = CONCAT71((int7)(int3)(uVar31 >> 8),local_90[(int)uVar31]) & 0xffffffffffffff03;
    if ((char)uVar32 == '\x01') {
      uVar32 = CONCAT71((int7)(int3)(uVar40 >> 8),local_90[(int)uVar40]) & 0xffffffffffffff03;
      bVar51 = (char)uVar32 != '\x01';
      local_38 = CONCAT71((int7)(uVar32 >> 8),bVar51);
      if ((bVar51) && ((short)local_c4 != 0)) goto LAB_0023911b;
    }
    else {
      local_38 = CONCAT71((int7)(uVar32 >> 8),1);
      if ((local_6c & 4) != 0) goto LAB_0023911b;
    }
  }
  else {
    uVar25 = local_80[uVar44].x - local_80[uVar36].x;
    uVar32 = -uVar25;
    if (0 < (long)uVar25) {
      uVar32 = uVar25;
    }
    if (uVar32 <= local_108) goto LAB_002390a7;
    local_38 = 0;
  }
LAB_002390e5:
  lVar41 = lVar49;
  if ((local_6c & 1) == 0) {
    if (lVar33 < lVar49) {
      lVar41 = lVar33;
    }
    local_54 = local_54 & 0xff;
    if (lVar33 < lVar49) {
      local_54 = (uint)(byte)local_38;
    }
  }
  else {
    if (lVar49 < lVar33) {
      lVar41 = lVar33;
    }
    local_54 = local_54 & 0xff;
    if (lVar49 < lVar33) {
      local_54 = (uint)(byte)local_38;
    }
  }
  lVar49 = lVar41;
LAB_0023911b:
  FVar12 = FVar12 + 1;
  if (FVar12 == local_c8) goto LAB_002391df;
  goto LAB_00238b4c;
LAB_002391df:
  pcVar14 = local_d8;
  if ((lVar49 != -0x80000000) && (lVar49 != 0x7fffffff)) {
    if ((char)local_54 == '\0') {
      uVar21 = (uint)local_a8;
      pFVar22 = (FT_Pos *)auStack_c3d8;
      local_a8 = (ulong)(uVar21 + 1);
    }
    else {
      uVar21 = (uint)local_b0;
      pFVar22 = &dummy[0].axis[1].org_delta;
      local_b0 = (ulong)(uVar21 + 1);
    }
    pFVar22[uVar21] = lVar49;
  }
LAB_00239241:
  cVar1 = *pcVar14;
  if (cVar1 == '\0') goto code_r0x0023924e;
  goto joined_r0x00238ad9;
code_r0x0023924e:
  uVar35 = (uint)local_a8;
  uVar21 = (uint)local_b0;
  if (uVar35 == 0 && uVar21 == 0) goto LAB_00239400;
  if (1 < uVar21) {
    uVar32 = 1;
    lVar49 = 0;
    do {
      lVar41 = *(long *)((long)hints[0].axis[0].embedded.segments + uVar32 * 8 + -0x78);
      lVar33 = lVar49;
      do {
        lVar27 = *(long *)((long)hints[0].axis[0].embedded.segments + lVar33 * 8 + -0x78);
        if (lVar27 <= lVar41) break;
        *(long *)((long)hints[0].axis[0].embedded.segments + lVar33 * 8 + -0x70) = lVar27;
        *(long *)((long)hints[0].axis[0].embedded.segments + lVar33 * 8 + -0x78) = lVar41;
        bVar51 = lVar33 != 0;
        lVar33 = lVar33 + -1;
      } while (bVar51);
      uVar32 = uVar32 + 1;
      lVar49 = lVar49 + 1;
    } while (uVar32 != (local_b0 & 0xffffffff));
  }
  if (uVar35 < 2) {
    uVar11 = local_50->axis[1].blue_count;
    pAVar18 = local_d0 + uVar11;
    local_50->axis[1].blue_count = uVar11 + 1;
    if (uVar35 == 0) {
      pFVar22 = &dummy[0].axis[1].org_delta;
      goto LAB_002393cb;
    }
    if (uVar21 == 0) {
      uVar21 = 0;
      goto LAB_002393c4;
    }
LAB_0023935c:
    lVar49 = *(long *)((long)dummy[0].axis[0].widths + (ulong)(uVar35 >> 1) * 8 + -0x70);
    (pAVar18->ref).org = lVar49;
    lVar41 = *(long *)((long)hints[0].axis[0].embedded.segments +
                      (local_b0 >> 1 & 0x7fffffff) * 8 + -0x78);
    (pAVar18->shoot).org = lVar41;
    uVar21 = (uint)local_98->properties;
    if ((lVar41 != lVar49) && (lVar41 <= lVar49 == ((local_98->properties & 3) != 0))) {
      lVar49 = (lVar41 + lVar49) / 2;
      (pAVar18->shoot).org = lVar49;
      (pAVar18->ref).org = lVar49;
    }
  }
  else {
    uVar32 = 1;
    lVar49 = 0;
    do {
      lVar41 = *(long *)((long)dummy[0].axis[0].widths + uVar32 * 8 + -0x70);
      lVar33 = lVar49;
      do {
        lVar27 = *(long *)((long)dummy[0].axis[0].widths + lVar33 * 8 + -0x70);
        if (lVar27 <= lVar41) break;
        *(long *)((long)dummy[0].axis[0].widths + lVar33 * 8 + -0x68) = lVar27;
        *(long *)((long)dummy[0].axis[0].widths + lVar33 * 8 + -0x70) = lVar41;
        bVar51 = lVar33 != 0;
        lVar33 = lVar33 + -1;
      } while (bVar51);
      uVar32 = uVar32 + 1;
      lVar49 = lVar49 + 1;
    } while (uVar32 != (local_a8 & 0xffffffff));
    uVar11 = local_50->axis[1].blue_count;
    pAVar18 = local_d0 + uVar11;
    local_50->axis[1].blue_count = uVar11 + 1;
    bVar51 = uVar21 != 0;
    uVar21 = uVar35;
    if (bVar51) goto LAB_0023935c;
LAB_002393c4:
    pFVar22 = (FT_Pos *)auStack_c3d8;
LAB_002393cb:
    FVar7 = pFVar22[uVar21 >> 1];
    (pAVar18->shoot).org = FVar7;
    (pAVar18->ref).org = FVar7;
    uVar21 = (uint)local_98->properties;
  }
  pAVar18->ascender = lVar15;
  pAVar18->descender = lVar24;
  uVar35 = uVar21 * 2 & 0xe;
  pAVar18->flags = uVar35;
  if ((uVar21 & 8) != 0) {
    pAVar18->flags = uVar35 | 0x10;
  }
LAB_00239400:
  AVar10 = local_98[1].string;
  pAVar23 = local_98 + 1;
  local_98 = pAVar23;
  if (AVar10 == AF_BLUE_STRING_MAX) goto LAB_00239420;
  goto LAB_00238aa3;
  while( true ) {
    local_38 = CONCAT44(local_38._4_4_,(int)uVar50);
    FVar12 = 0;
    af_latin_hints_link_segments((AF_GlyphHints)pFVar22,0,(AF_WidthRec *)0x0,(AF_Dimension)lVar15);
    lVar24 = (long)*(int *)&hints[0].axis[lVar15 + -1].embedded.edges[0xb].last;
    if (0 < lVar24) {
      uVar32 = *(ulong *)(hints[0].axis + lVar15);
      uVar25 = lVar24 * 0x50 + uVar32;
      FVar12 = 0;
      do {
        uVar17 = *(ulong *)(uVar32 + 0x20);
        if ((uVar17 != 0) &&
           ((FVar12 < 0x10 && uVar32 < uVar17) && uVar32 == *(ulong *)(uVar17 + 0x20))) {
          iVar46 = (int)*(short *)(uVar32 + 2) - (int)*(short *)(uVar17 + 2);
          uVar2 = (ushort)iVar46;
          uVar29 = -uVar2;
          if (0 < iVar46) {
            uVar29 = uVar2;
          }
          uVar17 = (ulong)FVar12;
          FVar12 = FVar12 + 1;
          metrics->axis[lVar15].widths[uVar17].org = (ulong)uVar29;
        }
        uVar32 = uVar32 + 0x50;
      } while (uVar32 < uVar25);
    }
    local_178[0] = FVar12;
    af_sort_and_quantize_widths
              (local_178,metrics->axis[lVar15].widths,(ulong)(FT_UInt)dummy[0].root.globals / 100);
    metrics->axis[lVar15].width_count = local_178[0];
    lVar15 = 1;
    uVar50 = 0;
    if ((local_38 & 1) == 0) break;
LAB_002396f3:
    pFVar22 = &dummy[0].axis[1].org_delta;
    FVar9 = af_latin_hints_compute_segments((AF_GlyphHints)pFVar22,(AF_Dimension)lVar15);
    if (FVar9 != 0) break;
  }
LAB_002389a7:
  pAVar48 = local_50;
  pFVar47 = local_60;
  lVar15 = 0;
  bVar51 = true;
  do {
    bVar28 = bVar51;
    if (metrics->axis[lVar15].width_count == 0) {
      pAVar23 = (AF_Blue_StringRec *)((ulong)local_50->units_per_em * 0x32 >> 0xb);
    }
    else {
      pAVar23 = (AF_Blue_StringRec *)metrics->axis[lVar15].widths[0].org;
    }
    metrics->axis[lVar15].edge_distance_threshold = (long)pAVar23 / 5;
    metrics->axis[lVar15].standard_width = (FT_Pos)pAVar23;
    metrics->axis[lVar15].extra_light = '\0';
    lVar15 = 1;
    bVar51 = false;
  } while (bVar28);
  af_glyph_hints_done((AF_GlyphHints)&dummy[0].axis[1].org_delta);
  AVar3 = ((pAVar48->root).style_class)->blue_stringset;
  uVar21 = pAVar48->units_per_em;
  local_a0 = (long *)ft_mem_alloc(pFVar47->memory,8,(FT_Error *)auStack_c3d8);
  AVar10 = af_blue_stringsets[AVar3].string;
  if (AVar10 != AF_BLUE_STRING_MAX) {
    local_108 = (ulong)(uVar21 >> 1) / 7;
    local_d0 = local_50->axis[1].blues;
    local_98 = af_blue_stringsets + AVar3;
LAB_00238aa3:
    cVar1 = af_blue_strings[AVar10];
    if (cVar1 != '\0') {
      pcVar14 = af_blue_strings + AVar10;
      local_a8 = 0;
      local_b0 = 0;
      lVar15 = 0;
      lVar24 = 0;
      plVar13 = local_a0;
joined_r0x00238ad9:
      while (cVar1 == ' ') {
        cVar1 = pcVar14[1];
        pcVar14 = pcVar14 + 1;
      }
      pcVar14 = af_shaper_get_cluster(pcVar14,&local_50->root,plVar13,local_178);
      local_c8 = local_178[0];
      if (local_178[0] != 0) {
        local_d8 = pcVar14;
        uVar2 = local_98->properties;
        lVar49 = -0x80000000;
        if ((uVar2 & 1) == 0) {
          lVar49 = 0x7fffffff;
        }
        FVar12 = 0;
        local_6c = (uint)uVar2;
        local_c4 = uVar2 & 4;
        local_54 = 0;
LAB_00238b4c:
        if (((*plVar13 != 0) &&
            (local_3c = FVar12, FVar9 = FT_Load_Glyph(pFVar47,(FT_UInt)*plVar13,1),
            FVar12 = local_3c, FVar9 == 0)) &&
           (pFVar5 = pFVar47->glyph, 2 < (pFVar5->outline).n_points)) {
          lVar41 = (long)(pFVar5->outline).n_contours;
          local_38 = 0;
          if (0 < lVar41) {
            local_c0 = lVar49;
            local_80 = (pFVar5->outline).points;
            local_90 = (pFVar5->outline).tags;
            local_78 = &local_80->y;
            uVar32 = 0xffffffff;
            lVar27 = 0;
            local_48 = local_48 & 0xffffffff00000000;
            uVar21 = 0;
            lVar33 = 0;
            do {
              iVar46 = (int)(pFVar5->outline).contours[lVar27];
              if ((int)uVar21 < iVar46) {
                lVar45 = (long)(int)uVar21;
                iVar30 = (int)uVar32;
                if ((local_6c & 3) == 0) {
                  lVar16 = (iVar46 - lVar45) + 1;
                  pFVar22 = local_78 + lVar45 * 2;
                  uVar35 = uVar21;
                  do {
                    lVar45 = *pFVar22;
                    if (((int)uVar32 < 0) || (lVar45 < lVar33)) {
                      lVar33 = lVar45;
                      uVar32 = (ulong)uVar35;
                      if (lVar45 <= lVar24) {
                        lVar24 = lVar45;
                      }
                    }
                    else if (lVar15 <= lVar45) {
                      lVar15 = lVar45;
                    }
                    uVar35 = uVar35 + 1;
                    pFVar22 = pFVar22 + 2;
                    lVar16 = lVar16 + -1;
                  } while (lVar16 != 0);
                }
                else {
                  lVar16 = (iVar46 - lVar45) + 1;
                  pFVar22 = local_78 + lVar45 * 2;
                  uVar35 = uVar21;
                  do {
                    lVar45 = *pFVar22;
                    if (((int)uVar32 < 0) || (lVar33 < lVar45)) {
                      lVar33 = lVar45;
                      uVar32 = (ulong)uVar35;
                      if (lVar15 <= lVar45) {
                        lVar15 = lVar45;
                      }
                    }
                    else if (lVar45 <= lVar24) {
                      lVar24 = lVar45;
                    }
                    uVar35 = uVar35 + 1;
                    pFVar22 = pFVar22 + 2;
                    lVar16 = lVar16 + -1;
                  } while (lVar16 != 0);
                }
                bVar51 = (int)uVar32 != iVar30;
                iVar30 = (uint)local_48;
                if (bVar51) {
                  iVar30 = iVar46;
                }
                local_48 = CONCAT44(local_48._4_4_,iVar30);
                if (bVar51) {
                  local_38 = (ulong)uVar21;
                }
              }
              uVar21 = iVar46 + 1;
              lVar27 = lVar27 + 1;
            } while (lVar27 != lVar41);
            uVar21 = (uint)uVar32;
            pFVar47 = local_60;
            plVar13 = local_a0;
            if ((int)uVar21 < 0) {
              local_38 = 0;
              goto LAB_002390e5;
            }
            local_78 = (FT_Pos *)local_80[uVar32].x;
            uVar25 = 0xffffffff;
            uVar17 = 0xffffffff;
            uVar39 = uVar32;
            if ((local_90[uVar32] & 3U) == 1) {
              uVar25 = uVar32;
              uVar17 = uVar32;
            }
            do {
              uVar35 = (uint)uVar39;
              uVar11 = uVar35 - 1;
              if ((int)uVar35 <= (int)(uint)local_38) {
                uVar11 = (uint)local_48;
              }
              uVar42 = local_80[(int)uVar11].y - lVar33;
              uVar39 = -uVar42;
              if (0 < (long)uVar42) {
                uVar39 = uVar42;
              }
              uVar42 = uVar32;
              if (5 < uVar39) {
                uVar37 = local_80[(int)uVar11].x - (long)local_78;
                uVar38 = -uVar37;
                if (0 < (long)uVar37) {
                  uVar38 = uVar37;
                }
                if (uVar38 <= uVar39 * 0x14) break;
              }
              uVar35 = (uint)uVar17;
              if ((int)(uint)uVar17 < 0) {
                uVar35 = uVar11;
              }
              if ((local_90[(int)uVar11] & 3U) == 1) {
                uVar25 = (ulong)uVar11;
                uVar17 = (ulong)uVar35;
              }
              uVar39 = (ulong)uVar11;
              uVar35 = uVar21;
            } while (uVar11 != uVar21);
            do {
              uVar44 = (uint)uVar17;
              uVar36 = (uint)uVar25;
              uVar11 = (int)uVar42 + 1;
              if ((int)(uint)local_48 <= (int)uVar42) {
                uVar11 = (uint)local_38;
              }
              uVar38 = local_80[(int)uVar11].y - lVar33;
              uVar39 = -uVar38;
              if (0 < (long)uVar38) {
                uVar39 = uVar38;
              }
              if (5 < uVar39) {
                uVar37 = local_80[(int)uVar11].x - (long)local_78;
                uVar38 = -uVar37;
                if (0 < (long)uVar37) {
                  uVar38 = uVar37;
                }
                uVar37 = uVar42;
                if (uVar38 <= uVar39 * 0x14) break;
              }
              if ((int)uVar36 < 0) {
                uVar36 = uVar11;
              }
              bVar51 = (local_90[(int)uVar11] & 3U) == 1;
              if (bVar51) {
                uVar25 = (ulong)uVar36;
              }
              uVar36 = (uint)uVar25;
              if (bVar51) {
                uVar17 = (ulong)uVar11;
              }
              uVar44 = (uint)uVar17;
              uVar37 = uVar32;
              uVar42 = (ulong)uVar11;
            } while (uVar11 != uVar21);
            uVar40 = (uint)uVar37;
            uVar31 = uVar35;
            if ((local_6c & 0x10) != 0) {
              uVar4 = local_50->units_per_em;
              local_b8 = (ulong)uVar4;
              uVar39 = (ulong)uVar4 / 0x19;
              uVar17 = local_80[(int)uVar40].x - local_80[(int)uVar35].x;
              uVar25 = -uVar17;
              if (0 < (long)uVar17) {
                uVar25 = uVar17;
              }
              if ((uVar25 < uVar39) &&
                 ((int)((uVar40 - uVar35) + 2) <= (int)((uint)local_48 - (uint)local_38))) {
                local_f8 = uVar39;
                do {
                  uVar8 = (int)uVar32 - 1;
                  if ((int)uVar32 <= (int)(uint)local_38) {
                    uVar8 = (uint)local_48;
                  }
                  uVar32 = (ulong)uVar8;
                  puVar6 = (undefined1 *)local_80[(int)uVar8].x;
                } while (((FT_Pos *)puVar6 == local_78) && (uVar8 != uVar21));
                if (uVar8 == uVar21) goto LAB_0023911b;
                local_100 = puVar6;
                local_b8 = (ulong)(uVar4 >> 2);
                bVar51 = false;
                local_84 = uVar40;
                local_68 = 0;
                local_64 = 0;
                do {
                  uVar21 = (uint)uVar37;
                  if (bVar51) {
                    lVar41 = (long)(int)local_84;
                  }
                  else {
                    lVar41 = (long)(int)uVar21;
                    local_68 = 0xffffffff;
                    if ((local_90[lVar41] & 3U) == 1) {
                      local_68 = uVar21;
                    }
                    local_84 = uVar21;
                    local_64 = local_68;
                  }
                  uVar8 = uVar21 + 1;
                  if ((int)(uint)local_48 <= (int)uVar21) {
                    uVar8 = (uint)local_38;
                  }
                  uVar37 = (ulong)uVar8;
                  lVar27 = local_80[lVar41].y;
                  uVar25 = lVar33 - lVar27;
                  uVar32 = -uVar25;
                  if (0 < (long)uVar25) {
                    uVar32 = uVar25;
                  }
                  if (uVar4 >> 2 < uVar32) {
                    bVar51 = false;
                  }
                  else {
                    local_e8 = uVar37;
                    local_118 = lVar27;
                    uVar25 = local_80[(int)uVar8].y - lVar27;
                    uVar32 = -uVar25;
                    if (0 < (long)uVar25) {
                      uVar32 = uVar25;
                    }
                    local_120 = local_80[(int)uVar8].x;
                    lVar41 = local_80[lVar41].x;
                    uVar17 = local_120 - lVar41;
                    uVar25 = -uVar17;
                    if (0 < (long)uVar17) {
                      uVar25 = uVar17;
                    }
                    uVar17 = uVar32 * 0x14;
                    if ((uVar32 < 6) || (uVar17 < uVar25)) {
                      local_110 = uVar17;
                      local_e0 = lVar41;
                      uVar21 = local_68;
                      if ((int)local_68 < 0) {
                        uVar21 = uVar8;
                      }
                      bVar51 = (local_90[(int)uVar8] & 3U) == 1;
                      if (bVar51) {
                        local_68 = uVar21;
                      }
                      if (bVar51) {
                        local_64 = uVar8;
                      }
                      bVar51 = true;
                      if ((lVar41 < local_120 == (long)puVar6 < (long)local_78) &&
                         (uVar39 <= uVar25)) {
                        uVar32 = (ulong)local_64;
                        uVar36 = local_68;
                        goto LAB_00239147;
                      }
                    }
                    else {
                      bVar51 = false;
                    }
                  }
                } while (uVar8 != uVar35);
              }
            }
            goto LAB_00239054;
          }
          lVar33 = 0;
          goto LAB_002390e5;
        }
        goto LAB_0023911b;
      }
      goto LAB_00239241;
    }
    goto LAB_00239400;
  }
LAB_00239420:
  ft_mem_free(pFVar47->memory,local_a0);
  pAVar48 = local_50;
  uVar21 = local_50->axis[1].blue_count;
  pAVar19 = (AF_Blue_StringRec *)(ulong)uVar21;
  if (pAVar19 != (AF_Blue_StringRec *)0x0) {
    pAVar23 = (AF_Blue_StringRec *)local_50->axis[1].blues;
    pAVar26 = (AF_Blue_StringRec *)0x0;
    do {
      *(AF_Blue_StringRec **)(local_178 + (long)pAVar26 * 2) = pAVar23;
      pAVar26 = (AF_Blue_StringRec *)((long)&pAVar26->string + 1);
      pAVar23 = pAVar23 + 9;
    } while (pAVar19 != pAVar26);
    if (uVar21 != 1) {
      pAVar23 = (AF_Blue_StringRec *)&DAT_00000001;
      lVar15 = 0;
      do {
        plVar13 = *(long **)(local_178 + (long)pAVar23 * 2);
        plVar34 = plVar13 + 3;
        if ((*(byte *)(plVar13 + 8) & 6) != 0) {
          plVar34 = plVar13;
        }
        lVar24 = *plVar34;
        lVar49 = lVar15;
        do {
          plVar34 = *(long **)(local_178 + lVar49 * 2);
          plVar43 = plVar34;
          if ((*(byte *)(plVar34 + 8) & 6) == 0) {
            plVar43 = plVar34 + 3;
          }
          if (*plVar43 <= lVar24) break;
          *(long **)(&num_idx_1 + lVar49 * 2) = plVar34;
          *(long **)(local_178 + lVar49 * 2) = plVar13;
          bVar51 = lVar49 != 0;
          lVar49 = lVar49 + -1;
        } while (bVar51);
        pAVar23 = (AF_Blue_StringRec *)((long)&pAVar23->string + 1);
        lVar15 = lVar15 + 1;
      } while (pAVar23 != pAVar19);
      if (uVar21 - 1 != 0) {
        uVar35 = *(uint *)((long *)CONCAT44(local_178[1],local_178[0]) + 8);
        pAVar23 = (AF_Blue_StringRec *)0x0;
        plVar13 = (long *)CONCAT44(local_178[1],local_178[0]);
        do {
          if ((uVar35 & 6) == 0) {
            lVar15 = 0;
          }
          else {
            lVar15 = 0x18;
          }
          plVar43 = *(long **)(&num_idx_1 + (long)pAVar23 * 2);
          uVar35 = *(uint *)(plVar43 + 8);
          plVar34 = plVar43;
          if ((uVar35 & 6) != 0) {
            plVar34 = plVar43 + 3;
          }
          if (*plVar34 < *(long *)((long)plVar13 + lVar15)) {
            *(long *)((long)plVar13 + lVar15) = *plVar34;
          }
          pAVar23 = (AF_Blue_StringRec *)((long)&pAVar23->string + 1);
          plVar13 = plVar43;
        } while ((AF_Blue_StringRec *)(ulong)(uVar21 - 1) != pAVar23);
      }
    }
  }
  dummy[0].axis[1].org_delta = 0;
  p = auStack_c3d8;
  auStack_c3d8 = (uint  [2])0x2033203220312030;
  dummy[0].root.style_class = (AF_StyleClass)0x2037203620352034;
  dummy[0].root.scaler.face = (FT_Face)CONCAT44(dummy[0].root.scaler.face._4_4_,0x392038);
  plVar13 = (long *)ft_mem_alloc(pFVar47->memory,8,(FT_Error *)local_178);
  uVar50 = CONCAT71((int7)((ulong)pAVar23 >> 8),1);
  local_48 = 0;
LAB_00239574:
  do {
    if ((char)*p == '\0') {
LAB_002395e9:
      FVar20 = '\x01';
      break;
    }
    local_38 = CONCAT44(local_38._4_4_,(int)uVar50);
    while ((p = (uint *)af_shaper_get_cluster((char *)p,&pAVar48->root,plVar13,local_178),
           1 < local_178[0] ||
           (lVar15 = *plVar13,
           FT_Get_Advance(((local_50->root).globals)->face,(FT_UInt)lVar15,0x803,
                          &dummy[0].axis[1].org_delta), pAVar48 = local_50, lVar15 == 0))) {
      if ((char)*p == '\0') goto LAB_002395e9;
    }
    if ((local_38 & 1) != 0) {
      uVar50 = 0;
      local_48 = dummy[0].axis[1].org_delta;
      goto LAB_00239574;
    }
    uVar50 = 0;
    FVar20 = '\0';
  } while (dummy[0].axis[1].org_delta == local_48);
  face = local_60;
  ft_mem_free(local_60->memory,plVar13);
  (pAVar48->root).digits_have_same_width = FVar20;
  charmap = local_f0;
LAB_0023960b:
  FT_Set_Charmap(face,charmap);
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_latin_metrics_init( AF_LatinMetrics  metrics,
                         FT_Face          face )
  {
    FT_CharMap  oldmap = face->charmap;


    metrics->units_per_em = face->units_per_EM;

    if ( !FT_Select_Charmap( face, FT_ENCODING_UNICODE ) )
    {
      af_latin_metrics_init_widths( metrics, face );
      af_latin_metrics_init_blues( metrics, face );
      af_latin_metrics_check_digits( metrics, face );
    }

    FT_Set_Charmap( face, oldmap );
    return FT_Err_Ok;
  }